

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O1

bool __thiscall
duckdb::CatalogSearchPath::SchemaInSearchPath
          (CatalogSearchPath *this,ClientContext *context,string *catalog_name,string *schema_name)

{
  pointer pCVar1;
  bool bVar2;
  bool bVar3;
  string *l2;
  CatalogSearchEntry *path;
  pointer l1;
  int iVar4;
  
  l1 = (this->paths).
       super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->paths).
           super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar2 = l1 != pCVar1;
    if (!bVar2) {
      return bVar2;
    }
    bVar3 = StringUtil::CIEquals(&l1->schema,schema_name);
    iVar4 = 3;
    if (bVar3) {
      bVar3 = StringUtil::CIEquals(&l1->catalog,catalog_name);
      iVar4 = 1;
      if (!bVar3) {
        bVar3 = IsInvalidCatalog(&l1->catalog);
        if (bVar3) {
          l2 = DatabaseManager::GetDefaultDatabase_abi_cxx11_(context);
          bVar3 = StringUtil::CIEquals(catalog_name,l2);
          if (bVar3) goto LAB_00d571e3;
        }
        iVar4 = 0;
      }
    }
LAB_00d571e3:
    if ((iVar4 != 3) && (iVar4 != 0)) {
      return bVar2;
    }
    l1 = l1 + 1;
  } while( true );
}

Assistant:

bool CatalogSearchPath::SchemaInSearchPath(ClientContext &context, const string &catalog_name,
                                           const string &schema_name) const {
	for (auto &path : paths) {
		if (!StringUtil::CIEquals(path.schema, schema_name)) {
			continue;
		}
		if (StringUtil::CIEquals(path.catalog, catalog_name)) {
			return true;
		}
		if (IsInvalidCatalog(path.catalog) &&
		    StringUtil::CIEquals(catalog_name, DatabaseManager::GetDefaultDatabase(context))) {
			return true;
		}
	}
	return false;
}